

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxy.cpp
# Opt level: O0

void __thiscall Shell::EqualityProxy::addLocalAxioms(EqualityProxy *this,UnitList **units)

{
  EqualityProxy *this_00;
  Literal *pLVar1;
  int *in_RDI;
  TermList sort;
  Stack<Kernel::Literal_*> lits;
  undefined4 in_stack_fffffffffffffec8;
  uint in_stack_fffffffffffffecc;
  Clause *in_stack_fffffffffffffed0;
  size_t in_stack_fffffffffffffed8;
  Stack<Kernel::Literal_*> *in_stack_fffffffffffffee0;
  undefined1 uVar2;
  EqualityProxy *in_stack_fffffffffffffee8;
  TermList in_stack_fffffffffffffef0;
  TermList in_stack_fffffffffffffef8;
  TermList in_stack_ffffffffffffff00;
  LiteralStack *in_stack_ffffffffffffff38;
  EqualityProxy *in_stack_ffffffffffffff40;
  EqualityProxy *local_38;
  Stack<Kernel::Literal_*> local_30;
  
  Lib::Stack<Kernel::Literal_*>::Stack(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  uVar2 = (undefined1)((ulong)in_stack_fffffffffffffee0 >> 0x38);
  Kernel::TermList::TermList
            ((TermList *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
             SUB41((uint)in_stack_fffffffffffffec8 >> 0x18,0));
  Kernel::TermList::TermList
            ((TermList *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
             SUB41((uint)in_stack_fffffffffffffec8 >> 0x18,0));
  Kernel::TermList::TermList
            ((TermList *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
             SUB41((uint)in_stack_fffffffffffffec8 >> 0x18,0));
  makeProxyLiteral(in_stack_fffffffffffffee8,(bool)uVar2,in_stack_ffffffffffffff00,
                   in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  Lib::Stack<Kernel::Literal_*>::push
            ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffffed0,
             (Literal *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  createEqProxyAxiom(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  Lib::List<Kernel::Unit_*>::push
            (&in_stack_fffffffffffffed0->super_Unit,
             (List<Kernel::Unit_*> **)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8))
  ;
  if (((*in_RDI == 1) || (*in_RDI == 2)) || (*in_RDI == 3)) {
    Lib::Stack<Kernel::Literal_*>::reset(&local_30);
    Kernel::TermList::TermList
              ((TermList *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
               SUB41((uint)in_stack_fffffffffffffec8 >> 0x18,0));
    Kernel::TermList::TermList
              ((TermList *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
               SUB41((uint)in_stack_fffffffffffffec8 >> 0x18,0));
    in_stack_ffffffffffffff00._content =
         (uint64_t)
         makeProxyLiteral(in_stack_fffffffffffffee8,(bool)uVar2,in_stack_ffffffffffffff00,
                          in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    Lib::Stack<Kernel::Literal_*>::push
              ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffffed0,
               (Literal *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    Kernel::TermList::TermList
              ((TermList *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
               SUB41((uint)in_stack_fffffffffffffec8 >> 0x18,0));
    Kernel::TermList::TermList
              ((TermList *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
               SUB41((uint)in_stack_fffffffffffffec8 >> 0x18,0));
    in_stack_fffffffffffffef8._content =
         (uint64_t)
         makeProxyLiteral(in_stack_fffffffffffffee8,(bool)uVar2,in_stack_ffffffffffffff00,
                          in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    Lib::Stack<Kernel::Literal_*>::push
              ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffffed0,
               (Literal *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    in_stack_fffffffffffffef0._content =
         (uint64_t)createEqProxyAxiom(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    Lib::List<Kernel::Unit_*>::push
              (&in_stack_fffffffffffffed0->super_Unit,
               (List<Kernel::Unit_*> **)
               CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  }
  if ((*in_RDI == 2) || (*in_RDI == 3)) {
    Lib::Stack<Kernel::Literal_*>::reset(&local_30);
    Kernel::TermList::TermList
              ((TermList *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
               SUB41((uint)in_stack_fffffffffffffec8 >> 0x18,0));
    Kernel::TermList::TermList
              ((TermList *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
               SUB41((uint)in_stack_fffffffffffffec8 >> 0x18,0));
    this_00 = (EqualityProxy *)
              makeProxyLiteral(in_stack_fffffffffffffee8,(bool)uVar2,in_stack_ffffffffffffff00,
                               in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    Lib::Stack<Kernel::Literal_*>::push
              ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffffed0,
               (Literal *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    Kernel::TermList::TermList
              ((TermList *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
               SUB41((uint)in_stack_fffffffffffffec8 >> 0x18,0));
    Kernel::TermList::TermList
              ((TermList *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
               SUB41((uint)in_stack_fffffffffffffec8 >> 0x18,0));
    pLVar1 = makeProxyLiteral(this_00,(bool)uVar2,in_stack_ffffffffffffff00,
                              in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    uVar2 = (undefined1)((ulong)pLVar1 >> 0x38);
    Lib::Stack<Kernel::Literal_*>::push
              ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffffed0,
               (Literal *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    Kernel::TermList::TermList
              ((TermList *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
               SUB41((uint)in_stack_fffffffffffffec8 >> 0x18,0));
    Kernel::TermList::TermList
              ((TermList *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
               SUB41((uint)in_stack_fffffffffffffec8 >> 0x18,0));
    makeProxyLiteral(this_00,(bool)uVar2,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                     in_stack_fffffffffffffef0);
    Lib::Stack<Kernel::Literal_*>::push
              ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffffed0,
               (Literal *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    in_stack_fffffffffffffed0 = createEqProxyAxiom(local_38,in_stack_ffffffffffffff38);
    Lib::List<Kernel::Unit_*>::push
              (&in_stack_fffffffffffffed0->super_Unit,
               (List<Kernel::Unit_*> **)
               CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  }
  Lib::Stack<Kernel::Literal_*>::~Stack((Stack<Kernel::Literal_*> *)in_stack_fffffffffffffed0);
  return;
}

Assistant:

void EqualityProxy::addLocalAxioms(UnitList*& units)
{
  // reflexivity
  Stack<Literal*> lits;
  TermList sort = TermList(false, 0);

  lits.push(makeProxyLiteral(true,TermList(1,false),TermList(1,false), sort));
  UnitList::push(createEqProxyAxiom(lits),units);

  // symmetry
  if (_opt == Options::EqualityProxy::RS || _opt == Options::EqualityProxy::RST || _opt == Options::EqualityProxy::RSTC) {
    lits.reset();
    lits.push(makeProxyLiteral(false,TermList(1,false),TermList(2,false), sort));
    lits.push(makeProxyLiteral(true,TermList(2,false),TermList(1,false), sort));
    UnitList::push(createEqProxyAxiom(lits),units);
  }
  // transitivity
  if (_opt == Options::EqualityProxy::RST || _opt == Options::EqualityProxy::RSTC) {
    lits.reset();
    lits.push(makeProxyLiteral(false,TermList(1,false),TermList(2,false), sort));
    lits.push(makeProxyLiteral(false,TermList(2,false),TermList(3,false), sort));
    lits.push(makeProxyLiteral(true,TermList(1,false),TermList(3,false), sort));
    UnitList::push(createEqProxyAxiom(lits),units);
  }
}